

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>,toml::detail::either<toml::detail::character<(char)90>,toml::detail::character<(char)122>,toml::detail::sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>>>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>,toml::detail::either<toml::detail::character<(char)90>,toml::detail::character<(char)122>,toml::detail::sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>>>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  bool bVar1;
  value_type *other;
  region *v;
  success<toml::detail::region> local_e0;
  undefined4 local_98;
  failure_type local_81;
  region *local_80;
  undefined1 local_78 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region *reg_local;
  location *loc_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'.'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::at_least<1UL>_>_>_>_>,_toml::detail::either<toml::detail::character<'Z'>,_toml::detail::character<'z'>,_toml::detail::sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_78,(location *)this);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  if (bVar1) {
    local_80 = reg;
    location::reset((location *)this,(const_iterator)reg);
    none();
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_81);
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
    region::operator+=((region *)loc,other);
    ok<toml::detail::region&>(&local_e0,(toml *)loc,v);
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_e0);
    success<toml::detail::region>::~success(&local_e0);
  }
  local_98 = 1;
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return ok(reg);
    }